

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ReferenceParams *pRVar7;
  ulong uVar8;
  bool bVar9;
  int i;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int y;
  ConstPixelBufferAccess *pCVar13;
  int z;
  int lodOffsNdx;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector<float,_3> res_1;
  Vec2 clampedLod;
  Vec2 coordDy;
  Vector<float,_3> res;
  IVec2 srcSize;
  Vec2 coordDx;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vector<float,_2> res_9;
  Vec4 resPix;
  Vec4 refPix;
  Vec2 lodBias;
  Vec2 lodOffsets [4];
  undefined8 local_250;
  Vec2 local_248;
  float local_240;
  float local_23c;
  Vec4 local_238;
  float local_228 [4];
  float local_218;
  float local_214;
  ulong local_210;
  float local_208 [4];
  Vec3 local_1f8;
  ConstPixelBufferAccess *local_1e8;
  int local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  int local_1d0 [2];
  ReferenceParams *local_1c8;
  float local_1c0 [2];
  int local_1b8;
  PixelBufferAccess *local_1b0;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188 [8];
  float local_168 [8];
  float local_148 [8];
  float local_128 [6];
  float local_110 [2];
  undefined1 local_108 [32];
  ConstPixelBufferAccess local_e8;
  Texture2DArrayView *local_c0;
  ConstPixelBufferAccess *local_b8;
  float afStack_b0 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58 [10];
  
  local_1d0[1] = 0;
  local_1d0[0] = 0;
  if (0 < src->m_numLevels) {
    local_1d0[0] = (src->m_levels->m_size).m_data[0];
  }
  local_128[0] = *texCoord;
  local_148[0] = texCoord[1];
  local_128[1] = texCoord[3];
  local_128[2] = texCoord[6];
  local_128[3] = texCoord[9];
  local_148[1] = texCoord[4];
  local_148[2] = texCoord[7];
  local_148[3] = texCoord[10];
  local_168[0] = texCoord[2];
  local_168[1] = texCoord[5];
  local_168[2] = texCoord[8];
  local_168[3] = texCoord[0xb];
  if (0 < src->m_numLevels) {
    local_1d0[1] = (src->m_levels->m_size).m_data[1];
  }
  local_228[3] = (float)(result->m_size).m_data[0];
  local_23c = (float)(result->m_size).m_data[1];
  local_188[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_188[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_188[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_188[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar14 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar14 = (sampleParams->super_RenderParams).bias;
  }
  lVar10 = 0;
  do {
    afStack_b0[lVar10] = fVar14;
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_e8.m_format.order = 0xff00ff00;
  local_1e8 = result;
  local_1c8 = sampleParams;
  local_1b0 = errorMask;
  local_188[4] = local_188[2];
  local_188[5] = local_188[1];
  local_168[4] = local_168[2];
  local_168[5] = local_168[1];
  local_148[4] = local_148[2];
  local_148[5] = local_148[1];
  local_128[4] = local_128[2];
  local_128[5] = local_128[1];
  local_b8 = reference;
  tcu::RGBA::toVec((RGBA *)local_108);
  tcu::clear(local_1b0,(Vec4 *)local_108);
  if ((local_1e8->m_size).m_data[1] < 1) {
    local_210 = 0;
  }
  else {
    local_e8.m_data = &local_1c8->sampler;
    local_210 = 0;
    z = 0;
    pCVar13 = local_1e8;
    local_c0 = src;
    do {
      if (0 < (pCVar13->m_size).m_data[0]) {
        fVar14 = (float)z + 0.5;
        local_98 = ZEXT416((uint)fVar14);
        local_88 = ZEXT416((uint)(local_23c - fVar14));
        local_a8 = ZEXT416((uint)(fVar14 / local_23c));
        local_1a8 = 1.0 - fVar14 / local_23c;
        y = 0;
        local_1e0 = z;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_108,(int)pCVar13,y,z);
          tcu::ConstPixelBufferAccess::getPixel(&local_e8,(int)local_b8,y,z);
          local_1c0[0] = (float)local_e8.m_format.type;
          local_1c0[1] = (float)local_e8.m_size.m_data[0];
          local_1b8 = local_e8.m_size.m_data[1];
          local_208[0] = (float)local_108._4_4_;
          local_208[1] = (float)local_108._8_4_;
          local_208[2] = (float)local_108._12_4_;
          local_1f8.m_data[0] = 0.0;
          local_1f8.m_data[1] = 0.0;
          local_1f8.m_data[2] = 0.0;
          lVar10 = 0;
          do {
            local_1f8.m_data[lVar10] = local_1c0[lVar10] - local_208[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_238.m_data[2] = 0.0;
          local_238.m_data[0] = 0.0;
          local_238.m_data[1] = 0.0;
          lVar10 = 0;
          do {
            fVar14 = local_1f8.m_data[lVar10];
            fVar15 = -fVar14;
            if (-fVar14 <= fVar14) {
              fVar15 = fVar14;
            }
            local_238.m_data[lVar10] = fVar15;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_250 = local_250 & 0xffffffffff000000;
          lVar10 = 0;
          do {
            *(bool *)((long)&local_250 + lVar10) =
                 local_238.m_data[lVar10] <= nonShadowThreshold->m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          if (local_250._0_1_ == (tcu)0x0) {
LAB_00857e78:
            local_1f8.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_238);
            tcu::PixelBufferAccess::setPixel(local_1b0,&local_238,y,z,0);
            local_210 = (ulong)((int)local_210 + 1);
          }
          else {
            uVar8 = 0;
            do {
              uVar12 = uVar8;
              if (uVar12 == 2) break;
              uVar8 = uVar12 + 1;
            } while (*(char *)((long)&local_250 + uVar12 + 1) != '\0');
            if (uVar12 < 2) goto LAB_00857e78;
            if (((float)local_108._0_4_ != (float)local_e8.m_format.order) ||
               (NAN((float)local_108._0_4_) || NAN((float)local_e8.m_format.order))) {
              fVar18 = (float)y + 0.5;
              fVar16 = fVar18 / local_228[3];
              fVar15 = (float)local_a8._0_4_ + fVar16;
              fVar14 = (float)local_a8._0_4_;
              local_1dc = fVar18;
              if (1.0 <= fVar15) {
                fVar16 = 1.0 - fVar16;
                fVar14 = local_1a8;
                local_1dc = local_228[3] - fVar18;
              }
              uVar8 = (ulong)(1.0 <= fVar15);
              fVar17 = local_128[uVar8 * 3];
              fVar1 = local_128[uVar8 * 3 + 1];
              fVar19 = (1.0 - fVar16) - fVar14;
              fVar2 = local_188[uVar8 * 3];
              local_1d4 = local_188[uVar8 * 3 + 1];
              fVar3 = local_128[uVar8 * 3 + 2];
              local_1d8 = local_188[uVar8 * 3 + 2];
              fVar21 = fVar16 / local_1d8 + fVar14 / local_1d4 + fVar19 / fVar2;
              fVar4 = local_148[uVar8 * 3];
              fVar5 = local_148[uVar8 * 3 + 1];
              fVar6 = local_148[uVar8 * 3 + 2];
              local_1f8.m_data[1] =
                   ((fVar16 * fVar6) / local_1d8 +
                   (fVar14 * fVar5) / local_1d4 + (fVar19 * fVar4) / fVar2) / fVar21;
              local_1f8.m_data[0] =
                   ((fVar16 * fVar3) / local_1d8 +
                   (fVar14 * fVar1) / local_1d4 + (fVar19 * fVar17) / fVar2) / fVar21;
              local_1f8.m_data[2] =
                   ((local_168[uVar8 * 3 + 2] * fVar16) / local_1d8 +
                   (local_168[uVar8 * 3 + 1] * fVar14) / local_1d4 +
                   (fVar19 * local_168[uVar8 * 3]) / fVar2) / fVar21;
              local_214 = local_1d4 * local_1d8;
              fVar21 = fVar14 + -1.0;
              local_18c = local_1d8 * local_228[3];
              fVar20 = (local_228[3] * fVar21 + fVar18) * local_214 -
                       (local_18c * fVar14 + fVar18 * local_1d4) * fVar2;
              local_190 = (fVar1 - fVar17) * local_1d8 + (fVar3 - fVar1) * fVar2;
              local_194 = (fVar17 - fVar3) * local_1d4;
              local_198 = (fVar5 - fVar4) * local_1d8 + (fVar6 - fVar5) * fVar2;
              local_19c = (fVar4 - fVar6) * local_1d4;
              fVar18 = fVar2 * local_1d4 * local_1d8;
              fVar19 = fVar18 * local_228[3];
              fVar20 = fVar20 * fVar20;
              local_68 = ZEXT416((uint)fVar19);
              local_238.m_data[1] = ((fVar21 * local_19c + fVar14 * local_198) * fVar19) / fVar20;
              local_238.m_data[0] = ((local_194 * fVar21 + fVar14 * local_190) * fVar19) / fVar20;
              local_78 = -fVar2;
              local_208[0] = 0.0;
              local_208[1] = 0.0;
              lVar10 = 0;
              do {
                local_208[lVar10] = (float)local_1d0[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_1c0[0] = 0.0;
              local_1c0[1] = 0.0;
              lVar10 = 0;
              do {
                local_1c0[lVar10] = local_238.m_data[lVar10] * local_208[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              fVar14 = fVar16 + -1.0;
              local_1a0 = local_1d4 * local_23c;
              uStack_74 = 0x80000000;
              uStack_70 = 0x80000000;
              uStack_6c = 0x80000000;
              fVar19 = (local_23c * fVar14 + (float)local_98._0_4_) * local_214 +
                       (local_1a0 * fVar16 + (float)local_98._0_4_ * local_1d8) * local_78;
              local_1a4 = (fVar17 - fVar1) * local_1d8;
              local_240 = (fVar1 - fVar3) * fVar2 + (fVar3 - fVar17) * local_1d4;
              local_218 = (fVar5 - fVar6) * fVar2 + (fVar6 - fVar4) * local_1d4;
              local_228[2] = (fVar4 - fVar5) * local_1d8;
              fVar18 = fVar18 * local_23c;
              fVar19 = fVar19 * fVar19;
              local_108._16_16_ = ZEXT416((uint)fVar18);
              local_238.m_data[1] = ((fVar14 * local_228[2] + fVar16 * local_218) * fVar18) / fVar19
              ;
              local_238.m_data[0] = ((local_1a4 * fVar14 + fVar16 * local_240) * fVar18) / fVar19;
              local_250 = 0;
              lVar10 = 0;
              do {
                *(float *)((long)&local_250 + lVar10 * 4) = (float)local_1d0[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_208[0] = 0.0;
              local_208[1] = 0.0;
              lVar10 = 0;
              do {
                local_208[lVar10] =
                     local_238.m_data[lVar10] * *(float *)((long)&local_250 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_e8.m_size.m_data[2] =
                   ~-(uint)(1.0 <= fVar15) & local_98._0_4_ |
                   -(uint)(1.0 <= fVar15) & local_88._0_4_;
              local_e8.m_pitch.m_data[0] = local_98._4_4_;
              local_e8.m_pitch.m_data[1] = local_98._8_4_;
              local_e8.m_pitch.m_data[2] = local_98._12_4_;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)&local_250,local_1c0[0],local_1c0[1],local_208[0],local_208[1],
                         lodPrec);
              lVar10 = 0;
              do {
                fVar14 = local_58[lVar10 * 2] + local_1dc;
                fVar15 = local_58[lVar10 * 2 + 1] + (float)local_e8.m_size.m_data[2];
                fVar17 = fVar15 / local_23c;
                fVar16 = fVar17 + -1.0;
                fVar18 = (local_228[3] * fVar16 + fVar14) * local_214 +
                         (local_18c * fVar17 + local_1d4 * fVar14) * local_78;
                fVar18 = fVar18 * fVar18;
                local_228[1] = ((fVar16 * local_19c + fVar17 * local_198) * (float)local_68._0_4_) /
                               fVar18;
                local_228[0] = ((local_194 * fVar16 + local_190 * fVar17) * (float)local_68._0_4_) /
                               fVar18;
                local_248.m_data[0] = 0.0;
                local_248.m_data[1] = 0.0;
                lVar11 = 0;
                do {
                  local_248.m_data[lVar11] = (float)local_1d0[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar11 == 1);
                local_238.m_data[0] = 0.0;
                local_238.m_data[1] = 0.0;
                lVar11 = 0;
                do {
                  local_238.m_data[lVar11] = local_228[lVar11] * local_248.m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar11 == 1);
                fVar14 = fVar14 / local_228[3];
                fVar16 = fVar14 + -1.0;
                fVar15 = (local_23c * fVar16 + fVar15) * local_214 +
                         (local_1a0 * fVar14 + fVar15 * local_1d8) * local_78;
                fVar15 = fVar15 * fVar15;
                local_248.m_data[0] =
                     ((local_1a4 * fVar16 + local_240 * fVar14) * (float)local_108._16_4_) / fVar15;
                local_248.m_data[1] =
                     ((fVar16 * local_228[2] + fVar14 * local_218) * (float)local_108._16_4_) /
                     fVar15;
                local_110[0] = 0.0;
                local_110[1] = 0.0;
                lVar11 = 0;
                do {
                  local_110[lVar11] = (float)local_1d0[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar11 == 1);
                local_228[0] = 0.0;
                local_228[1] = 0.0;
                lVar11 = 0;
                do {
                  local_228[lVar11] = local_248.m_data[lVar11] * local_110[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar11 == 1);
                tcu::computeLodBoundsFromDerivates
                          ((tcu *)&local_248,local_238.m_data[0],local_238.m_data[1],local_228[0],
                           local_228[1],lodPrec);
                pRVar7 = local_1c8;
                local_250 = CONCAT44(~-(uint)(local_248.m_data[1] <= local_250._4_4_) &
                                     (uint)local_248.m_data[1] |
                                     (uint)local_250._4_4_ &
                                     -(uint)(local_248.m_data[1] <= local_250._4_4_),
                                     ~-(uint)((float)local_250 <= local_248.m_data[0]) &
                                     (uint)local_248.m_data[0] |
                                     (uint)(float)local_250 &
                                     -(uint)((float)local_250 <= local_248.m_data[0]));
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_238.m_data[0] = 0.0;
              local_238.m_data[1] = 0.0;
              lVar10 = 0;
              do {
                local_238.m_data[lVar10] =
                     *(float *)((long)&local_250 + lVar10 * 4) + afStack_b0[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_248.m_data[0] = local_1c8->minLod;
              local_248.m_data[1] = local_1c8->maxLod;
              tcu::clampLodBounds((tcu *)local_228,(Vec2 *)&local_238,&local_248,lodPrec);
              bVar9 = tcu::isTexCompareResultValid
                                (local_c0,(Sampler *)local_e8.m_data,comparePrec,&local_1f8,
                                 (Vec2 *)local_228,(pRVar7->super_RenderParams).ref,
                                 (float)local_108._0_4_);
              z = local_1e0;
              if (!bVar9) {
                local_248.m_data[0] = -1.7014636e+38;
                tcu::RGBA::toVec((RGBA *)&local_238);
                z = local_1e0;
                tcu::PixelBufferAccess::setPixel(local_1b0,&local_238,y,local_1e0,0);
                local_210 = (ulong)((int)local_210 + 1);
              }
            }
          }
          y = y + 1;
          pCVar13 = local_1e8;
        } while (y < (local_1e8->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (pCVar13->m_size).m_data[1]);
  }
  return (int)local_210;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DArrayView&		src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}